

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall cmCTestTestHandler::ProcessOptions(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  int level;
  cmValue cVar4;
  ostream *poVar5;
  string *__str;
  Repeat RVar6;
  string local_290;
  unsigned_long n;
  ostringstream cmCTestLog_msg;
  RegularExpression repeatRegex;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"TestsToRunInformation",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  SetTestsToRunInformation(this,cVar4);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"UseUnion",(allocator<char> *)&repeatRegex);
  cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  bVar2 = cmIsOn((cmValue)0x1a24b3);
  this->UseUnion = bVar2;
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ScheduleRandom",(allocator<char> *)&repeatRegex);
  cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  bVar2 = cmIsOn((cmValue)0x1a24f1);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (bVar2) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"Random",(allocator<char> *)&repeatRegex);
    cmCTest::SetScheduleType(pcVar1,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"Repeat",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value == (string *)0x0) goto LAB_001a26e2;
  cmsys::RegularExpression::RegularExpression
            (&repeatRegex,"^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
  bVar2 = cmsys::RegularExpression::find(&repeatRegex,cVar4.Value);
  if (bVar2) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              ((string *)&cmCTestLog_msg,&repeatRegex.regmatch,2);
    n = 1;
    cmStrToULong((string *)&cmCTestLog_msg,&n);
    this->RepeatCount = (int)n;
    if (1 < (int)n) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_290,&repeatRegex.regmatch,1);
      bVar3 = std::operator==(&local_290,"UNTIL_FAIL");
      RVar6 = UntilFail;
      if ((bVar3) || (bVar3 = std::operator==(&local_290,"UNTIL_PASS"), RVar6 = UntilPass, bVar3)) {
LAB_001a263b:
        this->RepeatMode = RVar6;
      }
      else {
        bVar3 = std::operator==(&local_290,"AFTER_TIMEOUT");
        if (bVar3) {
          RVar6 = AfterTimeout;
          goto LAB_001a263b;
        }
      }
      std::__cxx11::string::~string((string *)&local_290);
    }
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Repeat option invalid value: ");
    poVar5 = ::operator<<(poVar5,cVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x21c,local_290._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  cmsys::RegularExpression::~RegularExpression(&repeatRegex);
  if (!bVar2) {
    return false;
  }
LAB_001a26e2:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ParallelLevel",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg,"ParallelLevel",(allocator<char> *)&repeatRegex);
    __str = (string *)
            cmCTestGenericHandler::GetOption
                      (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
    if (__str == (string *)0x0) {
      __str = &cmValue::Empty_abi_cxx11_;
    }
    level = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    cmCTest::SetParallelLevel(pcVar1,level);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"StopOnFailure",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    cmCTest::SetStopOnFailure((this->super_cmCTestGenericHandler).CTest,true);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"LabelRegularExpression",(allocator<char> *)&local_290);
  cmCTestGenericHandler::GetMultiOption
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&repeatRegex,&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&repeatRegex,&this->IncludeLabelRegularExpressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&repeatRegex);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ExcludeLabelRegularExpression",(allocator<char> *)&local_290
            );
  cmCTestGenericHandler::GetMultiOption
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&repeatRegex,&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  BuildLabelRE((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&repeatRegex,&this->ExcludeLabelRegularExpressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&repeatRegex);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"IncludeRegularExpression",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    this->UseIncludeRegExpFlag = true;
    std::__cxx11::string::_M_assign((string *)&this->IncludeRegExp);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ExcludeRegularExpression",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    this->UseExcludeRegExpFlag = true;
    this->UseExcludeRegExpFirst = (bool)(this->UseIncludeRegExpFlag ^ 1);
    std::__cxx11::string::_M_assign((string *)&this->ExcludeRegExp);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ExcludeFixtureRegularExpression",
             (allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureRegExp);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ExcludeFixtureSetupRegularExpression",
             (allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureSetupRegExp);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ExcludeFixtureCleanupRegularExpression",
             (allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->ExcludeFixtureCleanupRegExp);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"ResourceSpecFile",(allocator<char> *)&repeatRegex);
  cVar4 = cmCTestGenericHandler::GetOption
                    (&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (cVar4.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg,"RerunFailed",(allocator<char> *)&repeatRegex);
  cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)&cmCTestLog_msg);
  bVar2 = cmIsOn((cmValue)0x1a2a55);
  this->RerunFailed = bVar2;
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  return true;
}

Assistant:

bool cmCTestTestHandler::ProcessOptions()
{
  // Update internal data structure from generic one
  this->SetTestsToRunInformation(this->GetOption("TestsToRunInformation"));
  this->SetUseUnion(cmIsOn(this->GetOption("UseUnion")));
  if (cmIsOn(this->GetOption("ScheduleRandom"))) {
    this->CTest->SetScheduleType("Random");
  }
  if (cmValue repeat = this->GetOption("Repeat")) {
    cmsys::RegularExpression repeatRegex(
      "^(UNTIL_FAIL|UNTIL_PASS|AFTER_TIMEOUT):([0-9]+)$");
    if (repeatRegex.find(repeat)) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->RepeatCount = static_cast<int>(n);
      if (this->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "UNTIL_FAIL") {
          this->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "UNTIL_PASS") {
          this->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "AFTER_TIMEOUT") {
          this->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Repeat option invalid value: " << repeat << std::endl);
      return false;
    }
  }
  if (this->GetOption("ParallelLevel")) {
    this->CTest->SetParallelLevel(std::stoi(this->GetOption("ParallelLevel")));
  }

  if (this->GetOption("StopOnFailure")) {
    this->CTest->SetStopOnFailure(true);
  }

  BuildLabelRE(this->GetMultiOption("LabelRegularExpression"),
               this->IncludeLabelRegularExpressions);
  BuildLabelRE(this->GetMultiOption("ExcludeLabelRegularExpression"),
               this->ExcludeLabelRegularExpressions);
  cmValue val = this->GetOption("IncludeRegularExpression");
  if (val) {
    this->UseIncludeRegExp();
    this->SetIncludeRegExp(val);
  }
  val = this->GetOption("ExcludeRegularExpression");
  if (val) {
    this->UseExcludeRegExp();
    this->SetExcludeRegExp(val);
  }
  val = this->GetOption("ExcludeFixtureRegularExpression");
  if (val) {
    this->ExcludeFixtureRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureSetupRegularExpression");
  if (val) {
    this->ExcludeFixtureSetupRegExp = *val;
  }
  val = this->GetOption("ExcludeFixtureCleanupRegularExpression");
  if (val) {
    this->ExcludeFixtureCleanupRegExp = *val;
  }
  val = this->GetOption("ResourceSpecFile");
  if (val) {
    this->ResourceSpecFile = *val;
  }
  this->SetRerunFailed(cmIsOn(this->GetOption("RerunFailed")));

  return true;
}